

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O2

void __thiscall NoViableAltException::NoViableAltException(NoViableAltException *this,RefToken *t)

{
  Ref *pRVar1;
  int iVar2;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"NoViableAlt",&local_41);
  ParserException::ParserException(&this->super_ParserException,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&(this->super_ParserException).super_ANTLRException =
       &PTR__NoViableAltException_00213ad8;
  pRVar1 = t->ref;
  if (pRVar1 != (Ref *)0x0) {
    pRVar1->count = pRVar1->count + 1;
  }
  (this->token).ref = pRVar1;
  (this->node).ref = (Ref *)0x0;
  iVar2 = (*t->ref->ptr->_vptr_Token[1])();
  (this->super_ParserException).line = iVar2;
  iVar2 = (**t->ref->ptr->_vptr_Token)();
  (this->super_ParserException).column = iVar2;
  return;
}

Assistant:

NoViableAltException::NoViableAltException(RefToken t)
: ParserException("NoViableAlt") // line ")+t.getLine()+" token is "+t.getText())
, token(t)
, node(0)
{
	line = t->getLine();
	column = t->getColumn();
}